

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O3

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_00;
  pointer pTVar1;
  uint uVar2;
  ComputationGraph *pCVar3;
  pointer pTVar4;
  pointer pVVar5;
  pointer ppNVar6;
  Node *pNVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  float *pfVar17;
  pointer pVVar18;
  pointer pTVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  ushort uVar29;
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar30 [32];
  undefined1 auVar39 [64];
  int iVar40;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  Dim dim;
  allocator_type local_b1;
  ulong local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  vector<bool,_std::allocator<bool>_> local_88;
  vector<bool,_std::allocator<bool>_> local_58;
  undefined1 auVar31 [32];
  
  pTVar19 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar21 = from_where->t;
  uVar25 = (ulong)uVar21;
  uVar23 = (ulong)(uVar21 + 1);
  if ((ulong)(((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar19 >> 3) *
             -0x71c71c71c71c71c7) < uVar23) {
    __assert_fail("from_where+1 <= nfxs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x56,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  pCVar3 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar23) {
    __assert_fail("from_where+1 <= cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x57,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  uVar26 = (ulong)pTVar19[uVar25].d.nd;
  if (uVar26 == 0) {
    iVar40 = 1;
  }
  else {
    auVar33 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar36 = vpbroadcastq_avx512f();
    uVar22 = 0;
    do {
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vmovdqa64_avx512f(auVar33);
      auVar33 = vporq_avx512f(auVar37,auVar34);
      auVar37 = vporq_avx512f(auVar37,auVar35);
      uVar10 = vpcmpuq_avx512f(auVar37,auVar36,2);
      bVar13 = (byte)uVar10;
      uVar10 = vpcmpuq_avx512f(auVar33,auVar36,2);
      bVar14 = (byte)uVar10;
      uVar29 = CONCAT11(bVar14,bVar13);
      auVar33 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar19[uVar25].d.d + uVar22));
      auVar37._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar33._4_4_;
      auVar37._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_;
      auVar37._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar33._8_4_;
      auVar37._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar33._12_4_;
      auVar37._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar33._16_4_;
      auVar37._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar33._20_4_;
      auVar37._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar33._24_4_;
      auVar37._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar33._28_4_;
      auVar37._32_4_ = (uint)(bVar14 & 1) * auVar33._32_4_;
      auVar37._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar33._36_4_;
      auVar37._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar33._40_4_;
      auVar37._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar33._44_4_;
      auVar37._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar33._48_4_;
      auVar37._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar33._52_4_;
      auVar37._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar33._56_4_;
      auVar37._60_4_ = (uint)(bVar14 >> 7) * auVar33._60_4_;
      uVar22 = uVar22 + 0x10;
      auVar33 = vpmulld_avx512f(auVar37,auVar38);
    } while ((uVar26 + 0xf & 0x1fffffff0) != uVar22);
    auVar33 = vmovdqa32_avx512f(auVar33);
    auVar34._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar38._0_4_;
    bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar28 * auVar33._4_4_ | (uint)!bVar28 * auVar38._4_4_;
    bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar28 * auVar33._8_4_ | (uint)!bVar28 * auVar38._8_4_;
    bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar28 * auVar33._12_4_ | (uint)!bVar28 * auVar38._12_4_;
    bVar28 = (bool)((byte)(uVar29 >> 4) & 1);
    auVar34._16_4_ = (uint)bVar28 * auVar33._16_4_ | (uint)!bVar28 * auVar38._16_4_;
    bVar28 = (bool)((byte)(uVar29 >> 5) & 1);
    auVar34._20_4_ = (uint)bVar28 * auVar33._20_4_ | (uint)!bVar28 * auVar38._20_4_;
    bVar28 = (bool)((byte)(uVar29 >> 6) & 1);
    auVar34._24_4_ = (uint)bVar28 * auVar33._24_4_ | (uint)!bVar28 * auVar38._24_4_;
    bVar28 = (bool)((byte)(uVar29 >> 7) & 1);
    auVar34._28_4_ = (uint)bVar28 * auVar33._28_4_ | (uint)!bVar28 * auVar38._28_4_;
    auVar34._32_4_ =
         (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar38._32_4_;
    bVar28 = (bool)(bVar14 >> 1 & 1);
    auVar34._36_4_ = (uint)bVar28 * auVar33._36_4_ | (uint)!bVar28 * auVar38._36_4_;
    bVar28 = (bool)(bVar14 >> 2 & 1);
    auVar34._40_4_ = (uint)bVar28 * auVar33._40_4_ | (uint)!bVar28 * auVar38._40_4_;
    bVar28 = (bool)(bVar14 >> 3 & 1);
    auVar34._44_4_ = (uint)bVar28 * auVar33._44_4_ | (uint)!bVar28 * auVar38._44_4_;
    bVar28 = (bool)(bVar14 >> 4 & 1);
    auVar34._48_4_ = (uint)bVar28 * auVar33._48_4_ | (uint)!bVar28 * auVar38._48_4_;
    bVar28 = (bool)(bVar14 >> 5 & 1);
    auVar34._52_4_ = (uint)bVar28 * auVar33._52_4_ | (uint)!bVar28 * auVar38._52_4_;
    bVar28 = (bool)(bVar14 >> 6 & 1);
    auVar34._56_4_ = (uint)bVar28 * auVar33._56_4_ | (uint)!bVar28 * auVar38._56_4_;
    auVar34._60_4_ =
         (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar38._60_4_;
    auVar30 = vextracti64x4_avx512f(auVar34,1);
    auVar33 = vpmulld_avx512f(auVar34,ZEXT3264(auVar30));
    auVar8 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpmulld_avx(auVar8,auVar9);
    auVar9 = vpshufd_avx(auVar8,0x55);
    auVar8 = vpmulld_avx(auVar8,auVar9);
    iVar40 = auVar8._0_4_;
  }
  if (iVar40 * pTVar19[uVar25].d.bd != 1) {
    std::operator<<((ostream *)&std::cerr,"backward() called on non-scalar node.\n");
    abort();
  }
  this_00 = &this->ndEdfs;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(this_00,uVar23);
  dEdfs->used = 0;
  if (uVar23 != 0) {
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pTVar19 = (this_00->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar26 = 0;
    do {
      pTVar4 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ = pTVar4[uVar26].d.bd;
      pTVar1 = pTVar4 + uVar26;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._8_8_ = *(undefined8 *)((pTVar1->d).d + 6);
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = *(_Bit_type **)(pTVar1->d).d;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = (pTVar1->d).d[2];
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._12_4_ = (pTVar1->d).d[3];
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = *(_Bit_type **)((pTVar1->d).d + 4);
      pTVar1 = pTVar4 + uVar26;
      uVar10 = *(undefined8 *)(pTVar1->d).d;
      uVar12 = *(undefined8 *)((pTVar1->d).d + 2);
      uVar15 = *(undefined8 *)((pTVar1->d).d + 4);
      uVar16 = *(undefined8 *)((pTVar1->d).d + 6);
      pTVar19[uVar26].d.bd = pTVar4[uVar26].d.bd;
      pTVar19 = pTVar19 + uVar26;
      *(undefined8 *)(pTVar19->d).d = uVar10;
      *(undefined8 *)((pTVar19->d).d + 2) = uVar12;
      *(undefined8 *)((pTVar19->d).d + 4) = uVar15;
      *(undefined8 *)((pTVar19->d).d + 6) = uVar16;
      uVar22 = (ulong)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ >> 0x20;
      if (uVar22 == 0) {
        iVar40 = 1;
      }
      else {
        auVar35 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar36 = vpbroadcastq_avx512f();
        uVar20 = 0;
        do {
          auVar37 = vpbroadcastq_avx512f();
          auVar38 = vmovdqa64_avx512f(auVar35);
          auVar35 = vporq_avx512f(auVar37,auVar33);
          auVar37 = vporq_avx512f(auVar37,auVar34);
          uVar10 = vpcmpuq_avx512f(auVar37,auVar36,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar35,auVar36,2);
          bVar14 = (byte)uVar10;
          uVar29 = CONCAT11(bVar14,bVar13);
          auVar35 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&local_88.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p + uVar20 * 4));
          auVar39._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar35._4_4_;
          auVar39._0_4_ = (uint)(bVar13 & 1) * auVar35._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar35._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar35._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar35._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar35._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar35._24_4_;
          auVar39._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar35._28_4_;
          auVar39._32_4_ = (uint)(bVar14 & 1) * auVar35._32_4_;
          auVar39._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar35._36_4_;
          auVar39._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar35._40_4_;
          auVar39._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar35._44_4_;
          auVar39._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar35._48_4_;
          auVar39._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar35._52_4_;
          auVar39._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar35._56_4_;
          auVar39._60_4_ = (uint)(bVar14 >> 7) * auVar35._60_4_;
          uVar20 = uVar20 + 0x10;
          auVar35 = vpmulld_avx512f(auVar39,auVar38);
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar20);
        auVar33 = vmovdqa32_avx512f(auVar35);
        auVar35._0_4_ =
             (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar38._0_4_;
        bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar28 * auVar33._4_4_ | (uint)!bVar28 * auVar38._4_4_;
        bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar28 * auVar33._8_4_ | (uint)!bVar28 * auVar38._8_4_;
        bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar28 * auVar33._12_4_ | (uint)!bVar28 * auVar38._12_4_;
        bVar28 = (bool)((byte)(uVar29 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar28 * auVar33._16_4_ | (uint)!bVar28 * auVar38._16_4_;
        bVar28 = (bool)((byte)(uVar29 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar28 * auVar33._20_4_ | (uint)!bVar28 * auVar38._20_4_;
        bVar28 = (bool)((byte)(uVar29 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar28 * auVar33._24_4_ | (uint)!bVar28 * auVar38._24_4_;
        bVar28 = (bool)((byte)(uVar29 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar28 * auVar33._28_4_ | (uint)!bVar28 * auVar38._28_4_;
        auVar35._32_4_ =
             (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar38._32_4_;
        bVar28 = (bool)(bVar14 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar28 * auVar33._36_4_ | (uint)!bVar28 * auVar38._36_4_;
        bVar28 = (bool)(bVar14 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar28 * auVar33._40_4_ | (uint)!bVar28 * auVar38._40_4_;
        bVar28 = (bool)(bVar14 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar28 * auVar33._44_4_ | (uint)!bVar28 * auVar38._44_4_;
        bVar28 = (bool)(bVar14 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar28 * auVar33._48_4_ | (uint)!bVar28 * auVar38._48_4_;
        bVar28 = (bool)(bVar14 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar28 * auVar33._52_4_ | (uint)!bVar28 * auVar38._52_4_;
        bVar28 = (bool)(bVar14 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar28 * auVar33._56_4_ | (uint)!bVar28 * auVar38._56_4_;
        auVar35._60_4_ =
             (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar38._60_4_;
        auVar30 = vextracti64x4_avx512f(auVar35,1);
        auVar33 = vpmulld_avx512f(auVar35,ZEXT3264(auVar30));
        auVar8 = vpmulld_avx(auVar33._0_16_,auVar33._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar40 = auVar8._0_4_;
      }
      pfVar17 = (float *)AlignedMemoryPool<6U>::allocate
                                   (dEdfs,(ulong)(iVar40 * (uint)local_88.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_end_of_storage) << 2)
      ;
      pTVar19 = (this_00->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pTVar19[uVar26].v = pfVar17;
      if (pfVar17 == (float *)0x0) {
        __assert_fail("ndEdfs[i].v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                      ,100,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
      }
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar23);
    if (dEdfs->used != 0) {
      memset(dEdfs->mem,0,dEdfs->used);
    }
  }
  (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].v = kSCALAR_ONE;
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_88,uVar23,(bool *)&local_58,(allocator_type *)local_a8);
  pCVar3 = (this->super_ExecutionEngine).cg;
  pVVar5 = (pCVar3->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar18 = (pCVar3->parameter_nodes).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_start; pVVar18 != pVVar5; pVVar18 = pVVar18 + 1) {
    local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[pVVar18->t >> 6] =
         local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[pVVar18->t >> 6] | 1L << ((ulong)pVVar18->t & 0x3f);
  }
  if (uVar21 + 1 != 0) {
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar30._8_4_ = 0x3f;
    auVar30._0_8_ = 0x3f0000003f;
    auVar30._12_4_ = 0x3f;
    auVar30._16_4_ = 0x3f;
    auVar30._20_4_ = 0x3f;
    auVar30._24_4_ = 0x3f;
    auVar30._28_4_ = 0x3f;
    auVar34 = vpbroadcastq_avx512f(ZEXT816(1));
    ppNVar6 = (pCVar3->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar26 = 0;
    do {
      pNVar7 = ppNVar6[uVar26];
      uVar20 = uVar26 >> 6 & 0x3ffffff;
      uVar24 = 1L << (uVar26 & 0x3f);
      uVar22 = local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar20];
      pVVar18 = *(pointer *)
                 &(pNVar7->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl;
      pVVar5 = (pNVar7->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar28 = (uVar22 >> (uVar26 & 0x3f) & 1) != 0;
      if (pVVar18 != pVVar5) {
        uVar27 = 0;
        auVar35 = vpbroadcastq_avx512f();
        auVar35 = vpsrlq_avx512f(auVar35,2);
        bVar13 = (uVar22 & uVar24) != 0;
        do {
          bVar14 = bVar13;
          auVar36 = vpbroadcastq_avx512f();
          auVar36 = vporq_avx512f(auVar36,auVar33);
          uVar11 = vpcmpuq_avx512f(auVar36,auVar35,2);
          auVar31 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(pVVar18 + uVar27));
          auVar32._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar31._4_4_;
          auVar32._0_4_ = (uint)((byte)uVar11 & 1) * auVar31._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar31._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar31._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar31._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar31._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar31._24_4_;
          auVar32._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar31._28_4_;
          uVar27 = uVar27 + 8;
          vpsrld_avx2(auVar32,6);
          auVar31 = vpand_avx2(auVar32,auVar30);
          auVar37 = vpgatherdq_avx512f((int)local_88.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p[1]);
          auVar38._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar37._8_8_;
          auVar38._0_8_ = (ulong)((byte)uVar11 & 1) * auVar37._0_8_;
          auVar38._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar37._16_8_;
          auVar38._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar37._24_8_;
          auVar38._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * auVar37._32_8_;
          auVar38._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * auVar37._40_8_;
          auVar38._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * auVar37._48_8_;
          auVar38._56_8_ = (uVar11 >> 7) * auVar37._56_8_;
          auVar37 = vpmovzxdq_avx512f(auVar31);
          auVar37 = vpsrlvq_avx512f(auVar38,auVar37);
          uVar10 = vptestmq_avx512f(auVar37,auVar34);
          bVar13 = bVar14 | (byte)uVar10;
        } while ((((ulong)((long)pVVar5 + (-4 - (long)pVVar18)) >> 2) + 8 & 0xfffffffffffffff8) !=
                 uVar27);
        uVar10 = vpcmpuq_avx512f(auVar36,auVar35,6);
        uVar12 = vpcmpuq_avx512f(auVar36,auVar35,2);
        bVar28 = (bVar13 & (byte)uVar12) != 0 || (bVar14 & (byte)uVar10) != 0;
      }
      uVar27 = uVar22 | uVar24;
      if (!bVar28) {
        uVar27 = ~uVar24 & uVar22;
      }
      uVar26 = uVar26 + 1;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar20] = uVar27;
    } while (uVar26 != uVar23);
  }
  auVar8[0xf] = 0;
  auVar8._0_15_ = local_a8._1_15_;
  local_a8 = auVar8 << 8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,uVar23,(bool *)local_a8,&local_b1);
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p[uVar21 >> 6] =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p[uVar21 >> 6] | 1L << (uVar25 & 0x3f);
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  if (-1 < (int)uVar21) {
    do {
      local_b0 = uVar25;
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar25 >> 6 & 0x3ffffff] >> (uVar25 & 0x3f) & 1)
          != 0) {
        pNVar7 = (((this->super_ExecutionEngine).cg)->nodes).
                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25];
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                  ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)local_a8,
                   (ulong)((long)(pNVar7->args).
                                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pNVar7->args).
                                super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
        uVar25 = local_b0;
        pVVar18 = (pNVar7->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar5 = (pNVar7->args).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if (pVVar18 != pVVar5) {
          uVar21 = 0;
          do {
            uVar2 = pVVar18->t;
            pVVar18 = pVVar18 + 1;
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
                 local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] |
                 1L << ((ulong)uVar2 & 0x3f);
            uVar23 = (ulong)uVar21;
            uVar21 = uVar21 + 1;
            *(pointer *)(local_a8._0_8_ + uVar23 * 8) =
                 (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar2;
          } while (pVVar18 != pVVar5);
          pVVar18 = (pNVar7->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar5 = (pNVar7->args).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pVVar18 != pVVar5) {
            uVar21 = 0;
            do {
              uVar2 = pVVar18->t;
              if ((local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
                   ((ulong)uVar2 & 0x3f) & 1) != 0) {
                pTVar19 = (this->ndEdfs).
                          super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                          super__Vector_impl_data._M_start;
                Node::backward(pNVar7,(vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                       *)local_a8,
                               (this->nfxs).
                               super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl
                               .super__Vector_impl_data._M_start + uVar25,pTVar19 + uVar25,uVar21,
                               pTVar19 + uVar2);
              }
              uVar21 = uVar21 + 1;
              pVVar18 = pVVar18 + 1;
            } while (pVVar18 != pVVar5);
          }
        }
      }
      uVar25 = local_b0 - 1;
    } while (0 < (long)local_b0);
  }
  pCVar3 = (this->super_ExecutionEngine).cg;
  pVVar5 = (pCVar3->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar18 = (pCVar3->parameter_nodes).
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_start; pVVar18 != pVVar5; pVVar18 = pVVar18 + 1) {
    pNVar7 = (((this->super_ExecutionEngine).cg)->nodes).
             super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[pVVar18->t];
    (*pNVar7->_vptr_Node[10])
              (pNVar7,(this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + pVVar18->t);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    assert(ndEdfs[i].v);
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}